

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsXmlParser.cpp
# Opt level: O1

QString * __thiscall
KDReports::XmlParser::extractText
          (QString *__return_storage_ptr__,XmlParser *this,QDomElement *element,QString *pId,
          QAbstractItemModel *currentModel,int currentRow)

{
  Data *pDVar1;
  char cVar2;
  int iVar3;
  Data<QHashPrivate::Node<QString,_QString>_> *pDVar4;
  QAbstractItemModel *pQVar5;
  Node<QString,_QString> *pNVar6;
  undefined8 extraout_RAX;
  ulong uVar7;
  ulong i;
  QString *pQVar8;
  const_iterator cVar9;
  QString id;
  QModelIndex index;
  QString modelName;
  undefined1 local_d8 [32];
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_98;
  QString *local_80;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  QAbstractItemModel *local_38;
  
  local_d8._0_8_ = (PrivateShared *)0x0;
  local_d8._8_8_ = L"id";
  local_d8._16_8_ = 2;
  local_98.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_80 = __return_storage_ptr__;
  local_38 = currentModel;
  cVar2 = QDomElement::hasAttribute((QString *)element);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  if (cVar2 == '\0') {
    local_d8._0_8_ = (PrivateShared *)0x0;
    local_d8._8_8_ = L"model";
    local_d8._16_8_ = 5;
    local_98.size = 0;
    local_98.d = (Data *)0x0;
    local_98.ptr = (char16_t *)0x0;
    cVar2 = QDomElement::hasAttribute((QString *)element);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    pQVar8 = local_80;
    if (cVar2 != '\0') {
      local_d8._0_8_ = (PrivateShared *)0x0;
      local_d8._8_8_ = L"model";
      local_d8._16_8_ = 5;
      local_b8.size = 0;
      local_b8.d = (Data *)0x0;
      local_b8.ptr = (char16_t *)0x0;
      local_78.size = 0;
      local_78.d = (Data *)0x0;
      local_78.ptr = (char16_t *)0x0;
      QDomElement::attribute((QString *)&local_98,(QString *)element);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      pQVar5 = modelForKey((QString *)&local_98);
      if (pQVar5 == (QAbstractItemModel *)0x0) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      }
      else {
        if (currentRow < 0 || pQVar5 != local_38) {
          local_b8.d = (Data *)0x0;
          local_b8.ptr = L"row";
          local_b8.size = 3;
          local_78.size = 0;
          local_78.d = (Data *)0x0;
          local_78.ptr = (char16_t *)0x0;
          local_58.size = 0;
          local_58.d = (Data *)0x0;
          local_58.ptr = (char16_t *)0x0;
          QDomElement::attribute((QString *)local_d8,(QString *)element);
          currentRow = QString::toInt((QString *)local_d8,(bool *)0x0,10);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        }
        local_b8.d = (Data *)0x0;
        local_b8.ptr = L"column";
        local_b8.size = 6;
        local_78.size = 0;
        local_78.d = (Data *)0x0;
        local_78.ptr = (char16_t *)0x0;
        local_58.size = 0;
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        QDomElement::attribute((QString *)local_d8,(QString *)element);
        iVar3 = QString::toInt((QString *)local_d8,(bool *)0x0,10);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        local_d8._0_8_ = (PrivateShared *)0xffffffffffffffff;
        local_d8._8_8_ = (char16_t *)0x0;
        local_d8._16_8_ = 0;
        (**(code **)(*(long *)pQVar5 + 0x60))(&local_b8,pQVar5,currentRow,iVar3,local_d8);
        (**(code **)(*(long *)pQVar5 + 0x90))(local_d8,pQVar5,&local_b8,0);
        pQVar8 = local_80;
        QVariant::toString();
        QVariant::~QVariant((QVariant *)local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        if (pQVar5 != (QAbstractItemModel *)0x0) {
          return pQVar8;
        }
      }
    }
  }
  else {
    local_98.d = (Data *)0x0;
    local_98.ptr = L"id";
    local_98.size = 2;
    local_b8.size = 0;
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (char16_t *)0x0;
    local_78.size = 0;
    local_78.d = (Data *)0x0;
    local_78.ptr = (char16_t *)0x0;
    QDomElement::attribute((QString *)local_d8,(QString *)element);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QString::operator=(pId,(QString *)local_d8);
    cVar9 = QHash<QString,_QString>::find(&this->m_textValues,(QString *)local_d8);
    pQVar8 = local_80;
    uVar7 = cVar9.i.bucket;
    pDVar4 = cVar9.i.d;
    if (pDVar4 != (Data<QHashPrivate::Node<QString,_QString>_> *)0x0 || uVar7 != 0) {
      i = (ulong)((uint)cVar9.i.bucket & 0x7f);
      if (pDVar4->spans[uVar7 >> 7].offsets[i] == 0xff) {
        extractText();
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        _Unwind_Resume(extraout_RAX);
      }
      pNVar6 = QHashPrivate::Span<QHashPrivate::Node<QString,_QString>_>::at
                         (pDVar4->spans + (uVar7 >> 7),i);
      pDVar1 = (pNVar6->value).d.d;
      (pQVar8->d).d = pDVar1;
      (pQVar8->d).ptr = (pNVar6->value).d.ptr;
      (pQVar8->d).size = (pNVar6->value).d.size;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_d8);
      if (pDVar4 != (Data<QHashPrivate::Node<QString,_QString>_> *)0x0 || uVar7 != 0) {
        return pQVar8;
      }
    }
    else {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_d8);
      pQVar8 = local_80;
    }
  }
  QDomElement::text();
  return pQVar8;
}

Assistant:

QString KDReports::XmlParser::extractText(const QDomElement &element, QString *pId, const QAbstractItemModel *currentModel, int currentRow) const
{
    if (element.hasAttribute(QStringLiteral("id"))) {
        const QString id = element.attribute(QStringLiteral("id"));
        *pId = id;
        const QHash<QString, QString>::const_iterator it = m_textValues.find(id);
        if (it != m_textValues.end()) {
            return *it;
        }
    } else if (element.hasAttribute(QStringLiteral("model"))) {
        const QString modelName = element.attribute(QStringLiteral("model"));
        QAbstractItemModel *model = KDReports::modelForKey(modelName);
        if (model) {
            int row;
            if (model == currentModel && currentRow > -1) {
                row = currentRow;
            } else {
                row = element.attribute(QStringLiteral("row")).toInt();
            }
            const int column = element.attribute(QStringLiteral("column")).toInt();
            const QModelIndex index = model->index(row, column);
            return model->data(index).toString();
        }
    }

    return element.text();
}